

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-iosim.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char *__s2;
  char local_bf8 [1504];
  char local_618 [8];
  char buffer [1500];
  char *smode;
  char *filename;
  int ch;
  int i;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  _ch = argv;
  argv_local._0_4_ = argc;
  MPI_Init(&argv_local,&ch);
  MPI_Comm_rank(&ompi_mpi_comm_world,&ThisTask);
  MPI_Comm_size(&ompi_mpi_comm_world,&NTask);
LAB_001035c7:
  do {
    iVar1 = getopt((int)argv_local,_ch,getoptstr);
    if (iVar1 == -1) {
      if (_optind == (int)argv_local) {
        usage();
      }
      else {
        __s2 = strdup(_ch[_optind]);
        mode = 0;
        while ((mode < 4 && (iVar1 = strcmp(MODES[mode],__s2), iVar1 != 0))) {
          mode = mode + 1;
        }
        if (mode == 4) {
          usage();
        }
        else {
          _optind = _optind + 1;
          sprintf(local_bf8,"%s",_ch[_optind]);
          if ((NTask < Nwriter) || (Nwriter == 0)) {
            info("############## CAUTION: you chose %d ranks and %d writers! ##############\n #  If you want %d writers, allocate at least %d ranks with <mpirun -n %d> #\n ################### Can only use %d writers instead! ###################\n"
                 ,(ulong)(uint)NTask,(ulong)(uint)Nwriter,(ulong)(uint)Nwriter,(ulong)(uint)Nwriter,
                 (ulong)(uint)Nwriter,NTask);
            Nwriter = NTask;
          }
          if (Nfile == 0) {
            Nfile = Nwriter;
          }
          iosim(local_bf8);
          if ((purge != 0) && (ThisTask == 0)) {
            sprintf(local_618,"rm -rf %s/TestBlock",local_bf8);
            system(local_618);
          }
        }
      }
      goto LAB_001038a2;
    }
    switch(iVar1) {
    case 0x41:
      aggregated = 1;
      break;
    case 0x66:
      iVar1 = __isoc99_sscanf(_optarg,"%d",&Nfile);
      if (iVar1 != 1) {
        usage();
        goto LAB_001038a2;
      }
      break;
    case 0x68:
    default:
      usage();
      goto LAB_001038a2;
    case 0x6e:
      iVar1 = __isoc99_sscanf(_optarg,"%d",&Nwriter);
      if (iVar1 != 1) {
        usage();
        goto LAB_001038a2;
      }
      break;
    case 0x70:
      purge = 1;
      break;
    case 0x73:
      iVar1 = __isoc99_sscanf(_optarg,"%td",&size);
      if (iVar1 != 1) {
        usage();
        goto LAB_001038a2;
      }
      break;
    case 0x77:
      goto switchD_00103619_caseD_77;
    }
  } while( true );
switchD_00103619_caseD_77:
  iVar1 = __isoc99_sscanf(_optarg,"%d",&nmemb);
  if (iVar1 != 1) {
    usage();
LAB_001038a2:
    MPI_Finalize();
    return 0;
  }
  goto LAB_001035c7;
}

Assistant:

int main(int argc, char * argv[]) {
    MPI_Init(&argc, &argv);
    
    MPI_Comm_rank(MPI_COMM_WORLD, &ThisTask);
    MPI_Comm_size(MPI_COMM_WORLD, &NTask);
    
    int i;
    int ch;
    char * filename = alloca(1500);
    
    while(-1 != (ch = getopt(argc, argv, getoptstr))) {
        switch(ch) {
            case 'A':
                aggregated = 1;
                break;
            case 'p':
                purge = 1;
                break;
            case 'w':
                if(1 != sscanf(optarg, "%d", &nmemb)) {
                    usage();
                    goto byebye;
                }
                break;
            case 'f':
                if(1 != sscanf(optarg, "%d", &Nfile)) {
                    usage();
                    goto byebye;
                }
                break;
            case 'n':
                if(1 != sscanf(optarg, "%d", &Nwriter)) {
                    usage();
                    goto byebye;
                }
                break;
            case 's':
                if(1 != sscanf(optarg, "%td", &size)) {
                    usage();
                    goto byebye;
                }
                break;
            case 'h':
            default:
                usage();
                goto byebye;
        }    
    }
    if(optind == argc) {
        usage();
        goto byebye;
    }

    char * smode = strdup(argv[optind]);
    for(mode = 0; mode < 4; mode ++) {
        if(0 == strcmp(MODES[mode], smode)) break;
    }
    if(mode == 4) {
        usage(); goto byebye;
    }

    optind++;

    sprintf(filename, "%s", argv[optind]);

    if (Nwriter > NTask || Nwriter == 0) {
        info("############## CAUTION: you chose %d ranks and %d writers! ##############\n"
             " #  If you want %d writers, allocate at least %d ranks with <mpirun -n %d> #\n"
             " ################### Can only use %d writers instead! ###################\n",
             NTask, Nwriter, Nwriter, Nwriter, Nwriter, NTask);
        Nwriter = NTask;
    }
    if (Nfile == 0) {
        Nfile = Nwriter;
    }

    iosim(filename);

    if (purge) {
        if(ThisTask == 0) {
            char buffer[1500];
            sprintf(buffer, "rm -rf %s/TestBlock", filename);
            system(buffer);
        }
    }
//+++++++++++++++++ Writing Time Log +++++++++++++++++
byebye:
    MPI_Finalize();
    return 0;
}